

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TokenStream * __thiscall Catch::clara::detail::TokenStream::operator++(TokenStream *this)

{
  const_iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  __position._M_current =
       (this->m_tokenBuffer).
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_tokenBuffer).
                     super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current) /
             0x28) < 2) {
    pbVar1 = (this->it)._M_current;
    if (pbVar1 != (this->itEnd)._M_current) {
      (this->it)._M_current = pbVar1 + 1;
    }
    loadBuffer(this);
  }
  else {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::erase
              (&this->m_tokenBuffer,__position);
  }
  return this;
}

Assistant:

auto operator++() -> TokenStream & {
            if( m_tokenBuffer.size() >= 2 ) {
                m_tokenBuffer.erase( m_tokenBuffer.begin() );
            } else {
                if( it != itEnd )
                    ++it;
                loadBuffer();
            }
            return *this;
        }